

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int big_array_iter_init(BigArrayIter *iter,BigArray *array)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  *(undefined8 *)&iter->contiguous = 0;
  iter->dataptr = (void *)0x0;
  iter->array = array;
  memset(iter,0,0x100);
  iter->dataptr = array->data;
  iVar1 = big_file_dtype_itemsize(array->dtype);
  lVar2 = (long)iVar1;
  iter->contiguous = 1;
  uVar3 = (ulong)(uint)array->ndim;
  while( true ) {
    if ((int)uVar3 < 1) {
      return 0;
    }
    if (array->strides[uVar3 - 1] != lVar2) break;
    lVar2 = lVar2 * array->dims[uVar3 - 1];
    uVar3 = uVar3 - 1;
  }
  iter->contiguous = 0;
  return 0;
}

Assistant:

int
big_array_iter_init(BigArrayIter * iter, BigArray * array)
{
    memset(iter, 0, sizeof(iter[0]));

    iter->array = array;

    memset(iter->pos, 0, sizeof(ptrdiff_t) * 32);
    iter->dataptr = array->data;

    /* see if the iter is contiguous */
    size_t elsize = big_file_dtype_itemsize(array->dtype);

    int i = 0; 
    ptrdiff_t stride_contiguous = elsize;
    iter->contiguous = 1;
    for(i = array->ndim - 1; i >= 0; i --) {
        if(array->strides[i] != stride_contiguous) {
            iter->contiguous = 0;
            break;
        }
        stride_contiguous *= array->dims[i];
    }
    return 0;
}